

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O2

void __thiscall
CGL::SceneObjects::DirectionalLight::DirectionalLight
          (DirectionalLight *this,Vector3D *rad,Vector3D *posLight,Vector3D *lightDir)

{
  double dVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  anon_union_32_3_e2189aaa_for_Vector3D_0 local_38;
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_sample_L_0011a9a8;
  (this->dirToLight).field_0.field_0.z = 0.0;
  (this->dirToLight).field_0.field_0.x = 0.0;
  (this->dirToLight).field_0.field_0.y = 0.0;
  (this->posLight).field_0.field_0.z = 0.0;
  (this->posLight).field_0.field_0.x = 0.0;
  (this->posLight).field_0.field_0.y = 0.0;
  (this->radiance).field_0.field_0.x = (rad->field_0).field_0.x;
  (this->radiance).field_0.field_0.y = (rad->field_0).field_0.y;
  (this->radiance).field_0.field_0.z = (rad->field_0).field_0.z;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = -(posLight->field_0).field_0.z;
  auVar5._12_4_ = 0x80000000;
  uVar2 = *(uint *)((long)&posLight->field_0 + 4);
  uVar3 = *(undefined4 *)((long)&posLight->field_0 + 8);
  uVar4 = *(uint *)((long)&posLight->field_0 + 0xc);
  *(undefined4 *)&(this->posLight).field_0 = *(undefined4 *)&posLight->field_0;
  *(uint *)((long)&(this->posLight).field_0 + 4) = uVar2 ^ 0x80000000;
  *(undefined4 *)((long)&(this->posLight).field_0 + 8) = uVar3;
  *(uint *)((long)&(this->posLight).field_0 + 0xc) = uVar4 ^ 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar5);
  (this->posLight).field_0.field_0.z = dVar1;
  Vector3D::unit((Vector3D *)&local_38.field_0,lightDir);
  auVar6._0_8_ = -local_38.field_0.z;
  auVar6._8_4_ = 0;
  auVar6._12_4_ = 0x80000000;
  *(undefined4 *)&(this->dirToLight).field_0 = local_38._0_4_;
  *(uint *)((long)&(this->dirToLight).field_0 + 4) = local_38._4_4_ ^ 0x80000000;
  *(undefined4 *)((long)&(this->dirToLight).field_0 + 8) = local_38._8_4_;
  *(uint *)((long)&(this->dirToLight).field_0 + 0xc) = local_38._12_4_ ^ 0x80000000;
  dVar1 = (double)vmovlps_avx(auVar6);
  (this->dirToLight).field_0.field_0.z = dVar1;
  return;
}

Assistant:

DirectionalLight::DirectionalLight(const Vector3D rad,const Vector3D posLight,
                                   const Vector3D lightDir)
    : radiance(rad) {
  this->posLight = -posLight;
  dirToLight = -lightDir.unit();
}